

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

opj_image_t * pgxtoimage(char *filename,opj_cparameters_t *parameters)

{
  opj_image_comp_t *poVar1;
  bool bVar2;
  byte bVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  OPJ_UINT32 OVar7;
  FILE *__stream;
  opj_image_t *poVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  char endian2;
  char endian1;
  int local_c4;
  int prec;
  int h;
  int w;
  int local_b4;
  int local_b0;
  int local_ac;
  opj_image_cmptparm_t cmptparm;
  char temp [32];
  char signtmp [32];
  
  cmptparm.dx = 0;
  cmptparm.dy = 0;
  cmptparm.w = 0;
  cmptparm.h = 0;
  cmptparm.x0 = 0;
  cmptparm.y0 = 0;
  cmptparm.prec = 0;
  cmptparm.bpp = 0;
  cmptparm.sgnd = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !\n",filename);
    return (opj_image_t *)0x0;
  }
  fseek(__stream,0,0);
  pcVar12 = signtmp;
  iVar5 = __isoc99_fscanf(__stream,"PG%[ \t]%c%c%[ \t+-]%d%[ \t]%d%[ \t]%d",temp,&endian1,&endian2,
                          pcVar12,&prec,temp,&w,temp,&h);
  if (iVar5 != 9) {
    pgxtoimage_cold_1();
    return (opj_image_t *)0x0;
  }
  cVar10 = '+';
  do {
    if (*pcVar12 == '-') {
      cVar10 = '-';
    }
    else if (*pcVar12 == '\0') {
      fgetc(__stream);
      iVar5 = prec;
      local_c4 = 1;
      if ((endian2 != 'L' || endian1 != 'M') && ((endian1 != 'L' || (local_c4 = 0, endian2 != 'M')))
         ) {
        pgxtoimage_cold_2();
        return (opj_image_t *)0x0;
      }
      cmptparm.x0 = parameters->image_offset_x0;
      cmptparm.y0 = parameters->image_offset_y0;
      cmptparm.w = parameters->image_offset_x0 + (w + -1) * parameters->subsampling_dx + 1;
      cmptparm.h = (h + -1) * parameters->subsampling_dy + parameters->image_offset_y0 + 1;
      cmptparm.sgnd = (OPJ_UINT32)(cVar10 == '-');
      local_b4 = 0;
      local_ac = 0;
      local_b0 = 0;
      if (prec < 8) {
        local_ac = 8 - prec;
        local_b0 = prec - local_ac;
        local_b4 = 1 << ((char)prec - 1U & 0x1f);
        if (cmptparm.sgnd == 0) {
          local_b4 = 0;
        }
        cmptparm.sgnd = 0;
        prec = 8;
      }
      cmptparm.bpp = prec;
      cmptparm.prec = prec;
      cmptparm.dx = parameters->subsampling_dx;
      cmptparm.dy = parameters->subsampling_dy;
      poVar8 = (opj_image_t *)opj_image_create(1,&cmptparm,2);
      if (poVar8 == (opj_image_t *)0x0) {
        fclose(__stream);
        return (opj_image_t *)0x0;
      }
      poVar8->x0 = cmptparm.x0;
      poVar8->y0 = cmptparm.x0;
      poVar8->x1 = cmptparm.w;
      poVar8->y1 = cmptparm.h;
      poVar1 = poVar8->comps;
      if (h * w < 1) {
        uVar11 = 0;
      }
      else {
        lVar13 = 0;
        uVar11 = 0;
        do {
          if (iVar5 < 8) {
            bVar3 = readuchar((FILE *)__stream);
            uVar6 = ((int)((uint)bVar3 + local_b4) >> ((byte)local_b0 & 0x1f)) +
                    ((uint)bVar3 + local_b4 << ((byte)local_ac & 0x1f));
            poVar1->data[lVar13] = uVar6 & 0xff;
            if ((int)uVar11 < (int)uVar6) {
              uVar11 = uVar6;
            }
          }
          else {
            if (poVar1->prec == 8) {
              OVar7 = poVar1->sgnd;
              bVar3 = readuchar((FILE *)__stream);
              if (OVar7 == 0) {
                uVar6 = (uint)bVar3;
              }
              else {
                uVar6 = (uint)(char)bVar3;
              }
            }
            else if (poVar1->prec < 0x11) {
              OVar7 = poVar1->sgnd;
              uVar4 = readushort((FILE *)__stream,local_c4);
              if (OVar7 == 0) {
                uVar6 = (uint)uVar4;
              }
              else {
                uVar6 = (uint)(short)uVar4;
              }
            }
            else {
              uVar6 = readuint((FILE *)__stream,local_c4);
            }
            if ((int)uVar11 < (int)uVar6) {
              uVar11 = uVar6;
            }
            poVar1->data[lVar13] = uVar6;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (long)h * (long)w);
      }
      fclose(__stream);
      OVar7 = 1;
      if (1 < (int)uVar11) {
        uVar9 = (ulong)uVar11;
        do {
          uVar9 = uVar9 >> 1;
          OVar7 = OVar7 + 1;
          bVar2 = 3 < uVar11;
          uVar11 = (uint)uVar9;
        } while (bVar2);
      }
      poVar1->bpp = OVar7;
      return poVar8;
    }
    pcVar12 = pcVar12 + 1;
  } while( true );
}

Assistant:

opj_image_t* pgxtoimage(const char *filename, opj_cparameters_t *parameters) {
    FILE *f = NULL;
    int w, h, prec;
    int i, numcomps, max;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm;	/* maximum of 1 component  */
    opj_image_t * image = NULL;
    int adjustS, ushift, dshift, force8;

    char endian1,endian2,sign;
    char signtmp[32];

    char temp[32];
    int bigendian;
    opj_image_comp_t *comp = NULL;

    numcomps = 1;
    color_space = OPJ_CLRSPC_GRAY;

    memset(&cmptparm, 0, sizeof(opj_image_cmptparm_t));

    max = 0;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !\n", filename);
        return NULL;
    }

    fseek(f, 0, SEEK_SET);
    if( fscanf(f, "PG%[ \t]%c%c%[ \t+-]%d%[ \t]%d%[ \t]%d",temp,&endian1,&endian2,signtmp,&prec,temp,&w,temp,&h) != 9){
        fclose(f);
        fprintf(stderr, "ERROR: Failed to read the right number of element from the fscanf() function!\n");
        return NULL;
    }

    i=0;
    sign='+';
    while (signtmp[i]!='\0') {
        if (signtmp[i]=='-') sign='-';
        i++;
    }

    fgetc(f);
    if (endian1=='M' && endian2=='L') {
        bigendian = 1;
    } else if (endian2=='M' && endian1=='L') {
        bigendian = 0;
    } else {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    /* initialize image component */

    cmptparm.x0 = (OPJ_UINT32)parameters->image_offset_x0;
    cmptparm.y0 = (OPJ_UINT32)parameters->image_offset_y0;
    cmptparm.w = !cmptparm.x0 ? (OPJ_UINT32)((w - 1) * parameters->subsampling_dx + 1) : cmptparm.x0 + (OPJ_UINT32)(w - 1) * (OPJ_UINT32)parameters->subsampling_dx + 1;
    cmptparm.h = !cmptparm.y0 ? (OPJ_UINT32)((h - 1) * parameters->subsampling_dy + 1) : cmptparm.y0 + (OPJ_UINT32)(h - 1) * (OPJ_UINT32)parameters->subsampling_dy + 1;

    if (sign == '-') {
        cmptparm.sgnd = 1;
    } else {
        cmptparm.sgnd = 0;
    }
    if(prec < 8)
    {
        force8 = 1;
        ushift = 8 - prec; dshift = prec - ushift;
        if(cmptparm.sgnd) adjustS = (1<<(prec - 1)); else adjustS = 0;
        cmptparm.sgnd = 0;
        prec = 8;
    }
    else ushift = dshift = force8 = adjustS = 0;

    cmptparm.prec = (OPJ_UINT32)prec;
    cmptparm.bpp = (OPJ_UINT32)prec;
    cmptparm.dx = (OPJ_UINT32)parameters->subsampling_dx;
    cmptparm.dy = (OPJ_UINT32)parameters->subsampling_dy;

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm, color_space);
    if(!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = cmptparm.x0;
    image->y0 = cmptparm.x0;
    image->x1 = cmptparm.w;
    image->y1 = cmptparm.h;

    /* set image data */

    comp = &image->comps[0];

    for (i = 0; i < w * h; i++) {
        int v;
        if(force8)
        {
            v = readuchar(f) + adjustS;
            v = (v<<ushift) + (v>>dshift);
            comp->data[i] = (unsigned char)v;

            if(v > max) max = v;

            continue;
        }
        if (comp->prec == 8) {
            if (!comp->sgnd) {
                v = readuchar(f);
            } else {
                v = (char) readuchar(f);
            }
        } else if (comp->prec <= 16) {
            if (!comp->sgnd) {
                v = readushort(f, bigendian);
            } else {
                v = (short) readushort(f, bigendian);
            }
        } else {
            if (!comp->sgnd) {
                v = (int)readuint(f, bigendian);
            } else {
                v = (int) readuint(f, bigendian);
            }
        }
        if (v > max)
            max = v;
        comp->data[i] = v;
    }
    fclose(f);
    comp->bpp = (OPJ_UINT32)int_floorlog2(max) + 1;

    return image;
}